

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenTableGet(BinaryenModuleRef module,char *name,BinaryenExpressionRef index,BinaryenType type)

{
  TableGet *pTVar1;
  string_view local_40;
  Builder local_30;
  
  local_30.wasm = module;
  wasm::Name::Name((Name *)&local_40,name);
  pTVar1 = wasm::Builder::makeTableGet(&local_30,(Name)local_40,index,(Type)type);
  return (BinaryenExpressionRef)pTVar1;
}

Assistant:

BinaryenExpressionRef BinaryenTableGet(BinaryenModuleRef module,
                                       const char* name,
                                       BinaryenExpressionRef index,
                                       BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeTableGet(name, (Expression*)index, Type(type)));
}